

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * pbrt::Union(LightBounds *__return_storage_ptr__,LightBounds *a,LightBounds *b)

{
  Float FVar1;
  Float FVar2;
  undefined1 auVar3 [16];
  float theta_o;
  undefined8 uVar4;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar7;
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Vector3<float> VVar15;
  DirectionCone c;
  undefined1 local_70 [24];
  DirectionCone local_58;
  DirectionCone local_44;
  
  if ((a->phi != 0.0) || (NAN(a->phi))) {
    if ((b->phi != 0.0) || (NAN(b->phi))) {
      FVar1 = a->cosTheta_o;
      auVar8 = (undefined1  [56])0x0;
      VVar15 = Normalize<float>(&a->w);
      local_70._8_4_ = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar5._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar8;
      local_70._0_8_ = vmovlps_avx(auVar5._0_16_);
      local_70[0x10] = false;
      FVar2 = b->cosTheta_o;
      auVar8 = (undefined1  [56])0x0;
      local_70._12_4_ = FVar1;
      VVar15 = Normalize<float>(&b->w);
      local_58.w.super_Tuple3<pbrt::Vector3,_float>.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar8;
      local_58.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar6._0_16_);
      local_58.empty = false;
      local_58.cosTheta = FVar2;
      Union(&local_44,(DirectionCone *)local_70,&local_58);
      theta_o = SafeACos(local_44.cosTheta);
      Union<float>((Bounds3<float> *)local_70,&a->b,&b->b);
      auVar3 = vmaxss_avx(ZEXT416((uint)b->theta_e),ZEXT416((uint)a->theta_e));
      LightBounds::LightBounds
                (__return_storage_ptr__,(Bounds3<float> *)local_70,&local_44.w,a->phi + b->phi,
                 theta_o,auVar3._0_4_,(bool)(b->twoSided | a->twoSided));
      return __return_storage_ptr__;
    }
    uVar4._0_4_ = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar4._4_4_ = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar7 = *(undefined8 *)&(a->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar9._0_4_ = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar9._4_4_ = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar10._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar10._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar11._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar11._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar12._0_4_ = a->phi;
    uVar12._4_4_ = a->theta_o;
    uVar13._0_4_ = a->theta_e;
    uVar13._4_4_ = a->cosTheta_o;
    uVar14._0_4_ = a->cosTheta_e;
    uVar14._4_1_ = a->twoSided;
    uVar14._5_3_ = *(undefined3 *)&a->field_0x39;
  }
  else {
    uVar4._0_4_ = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar4._4_4_ = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar7 = *(undefined8 *)&(b->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar9._0_4_ = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar9._4_4_ = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar10._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar10._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar11._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar11._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar12._0_4_ = b->phi;
    uVar12._4_4_ = b->theta_o;
    uVar13._0_4_ = b->theta_e;
    uVar13._4_4_ = b->cosTheta_o;
    uVar14._0_4_ = b->cosTheta_e;
    uVar14._4_1_ = b->twoSided;
    uVar14._5_3_ = *(undefined3 *)&b->field_0x39;
  }
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar11;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)uVar11 >> 0x20);
  __return_storage_ptr__->phi = (Float)(int)uVar12;
  __return_storage_ptr__->theta_o = (Float)(int)((ulong)uVar12 >> 0x20);
  __return_storage_ptr__->theta_e = (Float)(int)uVar13;
  __return_storage_ptr__->cosTheta_o = (Float)(int)((ulong)uVar13 >> 0x20);
  __return_storage_ptr__->cosTheta_e = (Float)(int)uVar14;
  __return_storage_ptr__->twoSided = (bool)(char)((ulong)uVar14 >> 0x20);
  *(int3 *)&__return_storage_ptr__->field_0x39 = (int3)((ulong)uVar14 >> 0x28);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar4 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar9;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar9 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar10;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar10 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

LightBounds Union(const LightBounds &a, const LightBounds &b) {
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;
    DirectionCone c =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float theta_o = SafeACos(c.cosTheta);
    return LightBounds(Union(a.b, b.b), c.w, a.phi + b.phi, theta_o,
                       std::max(a.theta_e, b.theta_e), a.twoSided | b.twoSided);
}